

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O0

EVP_PKEY * crypto_read_file(char *filePath,char *filePIN)

{
  BIO *bp;
  X509_SIG *p8_00;
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  X509_SIG *p8;
  EVP_PKEY *pkey;
  PKCS8_PRIV_KEY_INFO *p8inf;
  BIO *in;
  PKCS8_PRIV_KEY_INFO *local_28;
  EVP_PKEY *local_8;
  
  bp = BIO_new_file(in_RDI,"rb");
  if (bp == (BIO *)0x0) {
    fprintf(_stderr,"ERROR: Could open the PKCS#8 file: %s\n",in_RDI);
    return (EVP_PKEY *)0x0;
  }
  if (in_RSI == (char *)0x0) {
    local_28 = PEM_read_bio_PKCS8_PRIV_KEY_INFO
                         (bp,(PKCS8_PRIV_KEY_INFO **)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    if (local_28 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      fprintf(_stderr,
              "ERROR: Could not read the PKCS#8 file. Maybe it is encypted (--file-pin <PIN>)\n");
      return (EVP_PKEY *)0x0;
    }
  }
  else {
    p8_00 = PEM_read_bio_PKCS8(bp,(X509_SIG **)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    if (p8_00 == (X509_SIG *)0x0) {
      fprintf(_stderr,"ERROR: Could not read the PKCS#8 file. Maybe the file is not encrypted.\n");
      return (EVP_PKEY *)0x0;
    }
    sVar1 = strlen(in_RSI);
    local_28 = PKCS8_decrypt(p8_00,in_RSI,(int)sVar1);
    X509_SIG_free(p8_00);
    if (local_28 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      fprintf(_stderr,
              "ERROR: Could not decrypt the PKCS#8 file. Maybe wrong PIN to file (--file-pin <PIN>)\n"
             );
      return (EVP_PKEY *)0x0;
    }
  }
  local_8 = EVP_PKCS82PKEY(local_28);
  PKCS8_PRIV_KEY_INFO_free(local_28);
  if (local_8 == (EVP_PKEY *)0x0) {
    fprintf(_stderr,"ERROR: Could not convert the key.\n");
    local_8 = (EVP_PKEY *)0x0;
  }
  return (EVP_PKEY *)local_8;
}

Assistant:

EVP_PKEY* crypto_read_file(char* filePath, char* filePIN)
{
	BIO* in = NULL;
	PKCS8_PRIV_KEY_INFO* p8inf = NULL;
	EVP_PKEY* pkey = NULL;
	X509_SIG* p8 = NULL;

	if (!(in = BIO_new_file(filePath, "rb")))
	{
		fprintf(stderr, "ERROR: Could open the PKCS#8 file: %s\n", filePath);
		return NULL;
	}

	// The PKCS#8 file is encrypted
	if (filePIN)
	{
		p8 = PEM_read_bio_PKCS8(in, NULL, NULL, NULL);
		BIO_free(in);

		if (!p8)
		{
			fprintf(stderr, "ERROR: Could not read the PKCS#8 file. "
					"Maybe the file is not encrypted.\n");
			return NULL;
		}

		p8inf = PKCS8_decrypt(p8, filePIN, strlen(filePIN));
		X509_SIG_free(p8);

		if (!p8inf)
		{
			fprintf(stderr, "ERROR: Could not decrypt the PKCS#8 file. "
					"Maybe wrong PIN to file (--file-pin <PIN>)\n");
			return NULL;
		}
	}
	else
	{
		p8inf = PEM_read_bio_PKCS8_PRIV_KEY_INFO(in, NULL, NULL, NULL);
		BIO_free(in);

		if (!p8inf)
		{
			fprintf(stderr, "ERROR: Could not read the PKCS#8 file. "
					"Maybe it is encypted (--file-pin <PIN>)\n");
			return NULL;
		}
	}

	// Convert the PKCS#8 to OpenSSL
	pkey = EVP_PKCS82PKEY(p8inf);
	PKCS8_PRIV_KEY_INFO_free(p8inf);
	if (!pkey)
	{
		fprintf(stderr, "ERROR: Could not convert the key.\n");
		return NULL;
	}

	return pkey;
}